

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

result_type * __thiscall
pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
          (result_type *__return_storage_ptr__,parser<json_out_callbacks> *this)

{
  matcher<json_out_callbacks> *pmVar1;
  result_type *prVar2;
  int iVar3;
  _Elt_pointer puVar4;
  pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
  res;
  ushort local_5a;
  char *local_58;
  result_type *local_50;
  unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  local_48;
  char local_38;
  
  local_58 = "handler->is_done ()";
  local_50 = __return_storage_ptr__;
  while( true ) {
    prVar2 = local_50;
    puVar4 = (this->stack_).c.
             super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    iVar3 = (this->error_)._M_value;
    if ((puVar4 == (this->stack_).c.
                   super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur) || (iVar3 != 0)) {
      if (iVar3 == 0) {
        std::__cxx11::string::string((string *)local_50,(string *)&this->callbacks_);
      }
      else {
        (local_50->_M_dataplus)._M_p = (pointer)&local_50->field_2;
        local_50->_M_string_length = 0;
        (local_50->field_2)._M_local_buf[0] = '\0';
      }
      return prVar2;
    }
    if (puVar4 == (this->stack_).c.
                  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar4 = (this->stack_).c.
               super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    pmVar1 = puVar4[-1]._M_t.
             super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
             .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
             _M_head_impl;
    local_5a = 0;
    (*pmVar1->_vptr_matcher[2])(&local_48,pmVar1,this,&local_5a);
    if ((char)local_5a == '\x01') {
      local_5a = local_5a & 0xff00;
    }
    if ((puVar4[-1]._M_t.
         super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
        _M_head_impl)->state_ != 1) break;
    if (local_38 == '\0') {
      iVar3 = 0x740;
      local_58 = "res.second";
      goto LAB_0012329c;
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
    ::pop_back(&(this->stack_).c);
    std::
    unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ::~unique_ptr(&local_48);
  }
  iVar3 = 0x73f;
LAB_0012329c:
  assert_failed(local_58,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,iVar3);
}

Assistant:

auto parser<Callbacks>::eof () -> result_type {
            while (!stack_.empty () && !has_error ()) {
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, nothing<char> ());
                PSTORE_ASSERT (handler->is_done ());
                PSTORE_ASSERT (res.second);
                stack_.pop (); // release the topmost matcher object.
            }
            return has_error () ? details::default_return<result_type>::get ()
                                : this->callbacks ().result ();
        }